

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult * __thiscall
testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
          (AssertionResult *__return_storage_ptr__,internal *this,char *lhs_expression,
          char *rhs_expression,char (*lhs) [6],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  bool bVar1;
  
  bVar1 = std::operator==(rhs_expression,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lhs);
  if (bVar1) {
    testing::AssertionSuccess();
  }
  else {
    CmpHelperEQFailure<char[6],std::__cxx11::string>
              (__return_storage_ptr__,this,lhs_expression,rhs_expression,lhs,rhs);
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression,
                            const T1& lhs,
                            const T2& rhs) {
  if (lhs == rhs) {
    return AssertionSuccess();
  }

  return CmpHelperEQFailure(lhs_expression, rhs_expression, lhs, rhs);
}